

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::writeUnallocatedSpaceDescriptor(IsoWriter *this)

{
  uint32_t tagLocation;
  size_t in_RCX;
  uint32_t *buff32;
  IsoWriter *this_local;
  
  memset(this->m_buffer,0,0x800);
  tagLocation = absoluteSectorNum(this);
  anon_unknown.dwarf_b4dde::writeDescriptorTag(this->m_buffer,UnallocSpace,tagLocation);
  this->m_buffer[0x10] = '\x04';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,0x18);
  File::write(&this->m_file,(int)this + 0xa0,(void *)0x800,in_RCX);
  return;
}

Assistant:

void IsoWriter::writeUnallocatedSpaceDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::UnallocSpace, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);

    buff32[4] = 0x04;  // sequence number

    calcDescriptorCRC(m_buffer, 24);
    m_file.write(m_buffer, SECTOR_SIZE);
}